

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnReturnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  Module *this_00;
  Result RVar1;
  FuncType *pFVar2;
  pointer *__ptr;
  Expr *local_f8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  Location local_e0;
  Var local_c0;
  Var local_78;
  
  if (this->current_func_ != (Func *)0x0) {
    (this->current_func_->features_used).tailcall = true;
  }
  std::make_unique<wabt::ReturnCallIndirectExpr>();
  GetLocation(&local_c0.loc,this);
  Var::Var(&local_78,sig_index,&local_c0.loc);
  SetFuncDeclaration(this,(FuncDeclaration *)(local_f8 + 1),&local_78);
  Var::~Var(&local_78);
  GetLocation(&local_e0,this);
  Var::Var(&local_c0,table_index,&local_e0);
  Var::operator=((Var *)(local_f8 + 3),&local_c0);
  Var::~Var(&local_c0);
  this_00 = this->module_;
  GetLocation(&local_e0,this);
  Var::Var(&local_c0,sig_index,&local_e0);
  pFVar2 = Module::GetFuncType(this_00,&local_c0);
  Var::~Var(&local_c0);
  if (pFVar2 != (FuncType *)0x0) {
    (pFVar2->features_used).tailcall = true;
  }
  local_e8._M_head_impl = local_f8;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
  if (local_e8._M_head_impl != (Expr *)0x0) {
    (*(local_e8._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnReturnCallIndirectExpr(Index sig_index,
                                                Index table_index) {
  if (current_func_) {
    // syntactically, a return_call_indirect expr can occur in an init
    // expression (outside a function)
    current_func_->features_used.tailcall = true;
  }
  auto expr = std::make_unique<ReturnCallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index, GetLocation());
  FuncType* type = module_->GetFuncType(Var(sig_index, GetLocation()));
  if (type) {
    type->features_used.tailcall = true;
  }
  return AppendExpr(std::move(expr));
}